

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adsc.c
# Opt level: O0

void la_adsc_format_json(la_vstring *vstr,void *data)

{
  long in_RSI;
  _func_void_varargs *in_RDI;
  la_adsc_formatter_ctx_t ctx;
  la_adsc_msg_t *msg;
  undefined4 uVar1;
  uint in_stack_ffffffffffffffe4;
  
  if (*(long *)(in_RSI + 8) != 0) {
    uVar1 = 0;
    la_json_array_start((la_vstring *)((ulong)in_stack_ffffffffffffffe4 << 0x20),(char *)in_RDI);
    la_list_foreach((la_list *)CONCAT44(in_stack_ffffffffffffffe4,uVar1),in_RDI,(void *)0x171876);
    la_json_array_end((la_vstring *)0x171880);
    la_json_append_bool((la_vstring *)CONCAT44(in_stack_ffffffffffffffe4,uVar1),(char *)in_RDI,false
                       );
  }
  return;
}

Assistant:

void la_adsc_format_json(la_vstring *vstr, void const *data) {
	la_assert(vstr);
	la_assert(data);

	la_adsc_msg_t const *msg = data;
	if(msg->tag_list == NULL) {
		return;
	}
	la_adsc_formatter_ctx_t ctx = {
		.vstr = vstr,
		.indent = 0     // unused in JSON output
	};
	la_json_array_start(vstr, "tags");
	la_list_foreach(msg->tag_list, la_adsc_tag_output_json, &ctx);
	la_json_array_end(vstr);
	la_json_append_bool(vstr, "err", msg->err);
}